

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_constant_names.c
# Opt level: O0

void append_with_group(char **buffer,size_t buffer_size,size_t *required_size,char *string,
                      size_t length,psa_dh_group_t group)

{
  char *__s;
  size_t length_00;
  char *group_name;
  psa_dh_group_t group_local;
  size_t length_local;
  char *string_local;
  size_t *required_size_local;
  size_t buffer_size_local;
  char **buffer_local;
  
  __s = psa_dh_group_name(group);
  append(buffer,buffer_size,required_size,string,length);
  append(buffer,buffer_size,required_size,"(",1);
  if (__s == (char *)0x0) {
    append_integer(buffer,buffer_size,required_size,"0x%02x",(ulong)group);
  }
  else {
    length_00 = strlen(__s);
    append(buffer,buffer_size,required_size,__s,length_00);
  }
  append(buffer,buffer_size,required_size,")",1);
  return;
}

Assistant:

static void append_with_group(char **buffer, size_t buffer_size,
                              size_t *required_size,
                              const char *string, size_t length,
                              psa_dh_group_t group)
{
    const char *group_name = psa_dh_group_name(group);
    append(buffer, buffer_size, required_size, string, length);
    append(buffer, buffer_size, required_size, "(", 1);
    if (group_name != NULL) {
        append(buffer, buffer_size, required_size,
               group_name, strlen(group_name));
    } else {
        append_integer(buffer, buffer_size, required_size,
                       "0x%02x", group);
    }
    append(buffer, buffer_size, required_size, ")", 1);
}